

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int __thiscall icu_63::UnicodeSet::remove(UnicodeSet *this,char *__filename)

{
  int iVar1;
  uint uVar2;
  
  if (*(short *)(__filename + 8) < 0) {
    iVar1 = *(int *)(__filename + 0xc);
  }
  else {
    iVar1 = (int)*(short *)(__filename + 8) >> 5;
  }
  if (((iVar1 != 0) &&
      (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0)) &&
     ((this->fFlags & 1) == 0)) {
    uVar2 = getSingleCP((UnicodeString *)__filename);
    if ((int)uVar2 < 0) {
      UVector::removeElement(this->strings,__filename);
      if (this->pat != (char16_t *)0x0) {
        uprv_free_63(this->pat);
        this->pat = (char16_t *)0x0;
        this->patLen = 0;
      }
    }
    else {
      remove(this,(char *)(ulong)uVar2);
    }
  }
  return (int)this;
}

Assistant:

UnicodeSet& UnicodeSet::remove(const UnicodeString& s) {
    if (s.length() == 0 || isFrozen() || isBogus()) return *this;
    int32_t cp = getSingleCP(s);
    if (cp < 0) {
        strings->removeElement((void*) &s);
        releasePattern();
    } else {
        remove((UChar32)cp, (UChar32)cp);
    }
    return *this;
}